

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topology_linux.cpp
# Opt level: O0

int cds::OS::Linux::topology::init(EVP_PKEY_CTX *ctx)

{
  s_nProcessorCount = std::thread::hardware_concurrency();
  return 0x12bc08;
}

Assistant:

void topology::init()
    {
        s_nProcessorCount = std::thread::hardware_concurrency();
/*
         long n = ::sysconf( _SC_NPROCESSORS_ONLN );
         if ( n > 0 )
            s_nProcessorCount = static_cast<unsigned>( n );
         else {
            try {
                std::ifstream cpuinfo("/proc/cpuinfo");
                std::string line;

                unsigned int nProcCount = 0;
                while ( !cpuinfo.eof()) {
                    std::getline(cpuinfo,line);
                    if (!line.size())
                        continue;
                    if ( line.find( "processor" ) !=0 )
                        continue;
                    ++nProcCount;
                }
                s_nProcessorCount = nProcCount;
            }
            catch ( std::exception& ex ) {
                s_nProcessorCount = 1;
            }
         }
*/
    }